

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineVertexInputTests.cpp
# Opt level: O0

void vkt::pipeline::anon_unknown_0::writeVertexInputValueSint
               (deUint8 *destPtr,VkFormat format,int componentNdx,deInt32 value)

{
  deUint32 dVar1;
  deInt32 *pdVar2;
  deUint8 *destFormatPtr;
  deUint32 componentSize;
  deInt32 value_local;
  int componentNdx_local;
  VkFormat format_local;
  deUint8 *destPtr_local;
  
  dVar1 = getVertexFormatComponentSize(format);
  pdVar2 = (deInt32 *)(destPtr + dVar1 * componentNdx);
  if (dVar1 == 1) {
    *(char *)pdVar2 = (char)value;
  }
  else if (dVar1 == 2) {
    *(short *)pdVar2 = (short)value;
  }
  else if (dVar1 == 4) {
    *pdVar2 = value;
  }
  return;
}

Assistant:

void writeVertexInputValueSint (deUint8* destPtr, VkFormat format, int componentNdx, deInt32 value)
{
	const deUint32	componentSize	= getVertexFormatComponentSize(format);
	deUint8*		destFormatPtr	= ((deUint8*)destPtr) + componentSize * componentNdx;

	switch (componentSize)
	{
		case 1:
			*((deInt8*)destFormatPtr) = (deInt8)value;
			break;

		case 2:
			*((deInt16*)destFormatPtr) = (deInt16)value;
			break;

		case 4:
			*((deInt32*)destFormatPtr) = (deInt32)value;
			break;

		default:
			DE_ASSERT(false);
	}
}